

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O2

void __thiscall CEObserver::~CEObserver(CEObserver *this)

{
  this->_vptr_CEObserver = (_func_int **)&PTR__CEObserver_00145b10;
  std::vector<double,_std::allocator<double>_>::~vector(&this->vel_icrs_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->vel_cirs_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->pos_icrs_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->pos_cirs_);
  return;
}

Assistant:

CEObserver::~CEObserver(void)
{
    free_members();
}